

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

int __thiscall Js::DebuggerScope::GetScopeDepth(DebuggerScope *this)

{
  undefined8 local_20;
  DebuggerScope *currentDebuggerScope;
  int depth;
  DebuggerScope *this_local;
  
  currentDebuggerScope._4_4_ = 0;
  local_20 = this;
  while (local_20 != (DebuggerScope *)0x0) {
    local_20 = GetParentScope(local_20);
    currentDebuggerScope._4_4_ = currentDebuggerScope._4_4_ + 1;
  }
  return currentDebuggerScope._4_4_;
}

Assistant:

int DebuggerScope::GetScopeDepth() const
    {
        int depth = 0;
        const DebuggerScope* currentDebuggerScope = this;
        while (currentDebuggerScope)
        {
            currentDebuggerScope = currentDebuggerScope->GetParentScope();
            ++depth;
        }

        return depth;
    }